

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

void __thiscall DomResourceIcon::~DomResourceIcon(DomResourceIcon *this)

{
  void *pvVar1;
  long in_RDI;
  DomResourcePixmap *in_stack_ffffffffffffffb0;
  DomResourcePixmap *this_00;
  
  pvVar1 = *(void **)(in_RDI + 0x58);
  if (pvVar1 != (void *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(in_stack_ffffffffffffffb0);
    operator_delete(pvVar1,0x58);
  }
  pvVar1 = *(void **)(in_RDI + 0x60);
  if (pvVar1 != (void *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(in_stack_ffffffffffffffb0);
    operator_delete(pvVar1,0x58);
  }
  pvVar1 = *(void **)(in_RDI + 0x68);
  if (pvVar1 != (void *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(in_stack_ffffffffffffffb0);
    operator_delete(pvVar1,0x58);
  }
  pvVar1 = *(void **)(in_RDI + 0x70);
  if (pvVar1 != (void *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(in_stack_ffffffffffffffb0);
    operator_delete(pvVar1,0x58);
  }
  pvVar1 = *(void **)(in_RDI + 0x78);
  if (pvVar1 != (void *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(in_stack_ffffffffffffffb0);
    operator_delete(pvVar1,0x58);
  }
  pvVar1 = *(void **)(in_RDI + 0x80);
  if (pvVar1 != (void *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(in_stack_ffffffffffffffb0);
    operator_delete(pvVar1,0x58);
  }
  pvVar1 = *(void **)(in_RDI + 0x88);
  if (pvVar1 != (void *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(in_stack_ffffffffffffffb0);
    operator_delete(pvVar1,0x58);
  }
  this_00 = *(DomResourcePixmap **)(in_RDI + 0x90);
  if (this_00 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(this_00);
    operator_delete(this_00,0x58);
  }
  QString::~QString((QString *)0x1be671);
  QString::~QString((QString *)0x1be67f);
  QString::~QString((QString *)0x1be689);
  return;
}

Assistant:

DomResourceIcon::~DomResourceIcon()
{
    delete m_normalOff;
    delete m_normalOn;
    delete m_disabledOff;
    delete m_disabledOn;
    delete m_activeOff;
    delete m_activeOn;
    delete m_selectedOff;
    delete m_selectedOn;
}